

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O2

string * __thiscall
toml::detail::make_string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (string *__return_storage_ptr__,detail *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last)

{
  allocator<char> local_9;
  
  if (this == (detail *)first._M_current) {
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_9)
    ;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Iterator first, Iterator last)
{
    if(first == last) {return "";}
    return std::string(first, last);
}